

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_diff_expr.cpp
# Opt level: O0

bool anon_unknown.dwarf_39d3::test_derivative_random
               (string *str,string *derivative_str,uint32_t var_id,double xmin,double xmax)

{
  uint uVar1;
  reference pvVar2;
  ostream *poVar3;
  uint in_EDX;
  Expr *this;
  double dVar4;
  Environment *__value;
  Environment *in_stack_00000058;
  uint64_t in_stack_00000060;
  Expr *in_stack_00000068;
  double dfx_expect;
  double dfx;
  double x;
  int i;
  uniform_real_distribution<double> unif;
  int cnt;
  Expr diff;
  Expr expect;
  Expr expr;
  Expr *expr_00;
  ostream *in_stack_fffffffffffffec0;
  double in_stack_fffffffffffffec8;
  double in_stack_fffffffffffffed0;
  Environment *in_stack_fffffffffffffef8;
  int local_a4;
  int local_8c;
  size_t in_stack_ffffffffffffff80;
  bool in_stack_ffffffffffffff8e;
  bool in_stack_ffffffffffffff8f;
  Environment *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffb0;
  
  nivalis::parse(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f,
                 in_stack_ffffffffffffff8e,in_stack_ffffffffffffff80,in_stack_ffffffffffffffb0);
  expr_00 = (Expr *)0x0;
  nivalis::parse(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f,
                 in_stack_ffffffffffffff8e,in_stack_ffffffffffffff80,in_stack_ffffffffffffffb0);
  nivalis::Expr::diff(in_stack_00000068,in_stack_00000060,in_stack_00000058);
  local_8c = 0;
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)in_stack_fffffffffffffec0,(double)expr_00,
             5.39784998510458e-318);
  for (local_a4 = 0; local_a4 < 1000; local_a4 = local_a4 + 1) {
    this = (Expr *)std::uniform_real_distribution<double>::operator()
                             ((uniform_real_distribution<double> *)in_stack_fffffffffffffec0,
                              (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                               *)expr_00);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(anonymous_namespace)::env,
                        (ulong)in_EDX);
    *pvVar2 = (value_type)this;
    dVar4 = nivalis::Expr::operator()(this,in_stack_fffffffffffffef8);
    __value = (Environment *)nivalis::Expr::operator()(this,in_stack_fffffffffffffef8);
    in_stack_fffffffffffffef8 = __value;
    uVar1 = std::isnan(dVar4);
    if (((uVar1 & 1) == 0) || (uVar1 = std::isnan((double)__value), (uVar1 & 1) == 0)) {
      dVar4 = absrelerr<double>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      local_8c = (uint)(dVar4 < 1e-06) + local_8c;
    }
    else {
      local_8c = local_8c + 1;
    }
  }
  if (local_8c != 1000) {
    std::operator<<((ostream *)&std::cerr,"Derivative equiv test fail\ndiff   ");
    poVar3 = nivalis::operator<<(in_stack_fffffffffffffec0,expr_00);
    std::operator<<(poVar3,"\nexpect ");
    poVar3 = nivalis::operator<<(in_stack_fffffffffffffec0,expr_00);
    std::operator<<(poVar3,"\n");
  }
  nivalis::Expr::~Expr((Expr *)0x10ae52);
  nivalis::Expr::~Expr((Expr *)0x10ae5f);
  nivalis::Expr::~Expr((Expr *)0x10ae6c);
  return local_8c == 1000;
}

Assistant:

bool test_derivative_random(
            const std::string& str,
            const std::string& derivative_str,
            uint32_t var_id,
            double xmin = -100, double xmax = 100) {
        Expr expr = parse(str, env);
        Expr expect = parse(derivative_str, env);
        Expr diff = expr.diff(var_id, env);
        int cnt = 0;
        static const int N_ITER = 1000;
        std::uniform_real_distribution<double> unif(xmin, xmax);
        for (int i = 0; i < N_ITER; ++i) {
            double x = unif(test::reng);
            env.vars[var_id] = x;
            double dfx = diff(env);
            double dfx_expect = expect(env);
            if (std::isnan(dfx) && std::isnan(dfx_expect)) ++cnt;
            else cnt += (absrelerr(dfx, dfx_expect) < FLOAT_EPS);
        }
        if (cnt != N_ITER) {
            std::cerr << "Derivative equiv test fail\ndiff   " << diff <<
                "\nexpect " << expect << "\n";
            return false;
        }
        return true;
    }